

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

ExprP<tcu::Vector<float,_4>_> __thiscall
vkt::shaderexecutor::Functions::Normalize<4>::doExpand
          (Normalize<4> *this,ExpandContext *param_1,ArgExprs *args)

{
  deInt32 *pdVar1;
  ExprP<tcu::Vector<float,_4>_> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  ExprP<tcu::Vector<float,_4>_> EVar3;
  ExprP<float> local_28;
  SharedPtrStateBase *pSVar2;
  
  length<4>((Functions *)&local_28,in_RCX);
  EVar3 = shaderexecutor::operator/((shaderexecutor *)this,in_RCX,&local_28);
  pSVar2 = EVar3.super_ContainerExprPBase<tcu::Vector<float,_4>_>.
           super_ExprPBase<tcu::Vector<float,_4>_>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_4>_>_>.m_state;
  if (local_28.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_28.super_ExprPBase<float>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_28.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr
           = (Expr<float> *)0x0;
      (*(local_28.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
      pSVar2 = extraout_RDX;
    }
    LOCK();
    pdVar1 = &(local_28.super_ExprPBase<float>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_28.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_28.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_state)->_vptr_SharedPtrStateBase[1])();
      pSVar2 = extraout_RDX_00;
    }
  }
  EVar3.super_ContainerExprPBase<tcu::Vector<float,_4>_>.super_ExprPBase<tcu::Vector<float,_4>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_4>_>_>.m_state = pSVar2;
  EVar3.super_ContainerExprPBase<tcu::Vector<float,_4>_>.super_ExprPBase<tcu::Vector<float,_4>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_4>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_4>_> *)this;
  return (ExprP<tcu::Vector<float,_4>_>)
         EVar3.super_ContainerExprPBase<tcu::Vector<float,_4>_>.
         super_ExprPBase<tcu::Vector<float,_4>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_4>_>_>;
}

Assistant:

ExprP<Ret>	doExpand	(ExpandContext&, const ArgExprs& args) const
	{
		return args.a / length<Size>(args.a);
	}